

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::OperatorSubtractFun::GetFunctions(void)

{
  bool bVar1;
  ScalarFunction *in_RDI;
  LogicalType *in_stack_00000710;
  LogicalType *in_stack_00000718;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *subtract;
  ScalarFunction *this;
  LogicalTypeId in_stack_fffffffffffff13f;
  LogicalType *in_stack_fffffffffffff140;
  string *in_stack_fffffffffffff158;
  ScalarFunctionSet *in_stack_fffffffffffff160;
  LogicalType *in_stack_fffffffffffff638;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"-",&local_31);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffff160,in_stack_fffffffffffff158);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogicalType::Numeric();
  local_50 = local_68;
  local_70._M_current =
       (LogicalType *)
       ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)this,(__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                     *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator*(&local_70);
    SubtractFunction::GetFunction(in_stack_fffffffffffff638);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
    ScalarFunction::~ScalarFunction(this);
    SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
    ScalarFunction::~ScalarFunction(this);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(&local_70);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x125276c);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x125294b);
  LogicalType::~LogicalType((LogicalType *)0x1252958);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x12529cc);
  LogicalType::~LogicalType((LogicalType *)0x12529d9);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252a4d);
  LogicalType::~LogicalType((LogicalType *)0x1252a5a);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252ace);
  LogicalType::~LogicalType((LogicalType *)0x1252adb);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252b4f);
  LogicalType::~LogicalType((LogicalType *)0x1252b5c);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252bd0);
  LogicalType::~LogicalType((LogicalType *)0x1252bdd);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252c51);
  LogicalType::~LogicalType((LogicalType *)0x1252c5e);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_00000718,in_stack_00000710);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252cd2);
  LogicalType::~LogicalType((LogicalType *)0x1252cdf);
  LogicalType::LogicalType(in_stack_fffffffffffff140,in_stack_fffffffffffff13f);
  SubtractFunction::GetFunction(in_stack_fffffffffffff638);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,in_RDI);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1252d25);
  return (ScalarFunctionSet *)this;
}

Assistant:

ScalarFunctionSet OperatorSubtractFun::GetFunctions() {
	ScalarFunctionSet subtract("-");
	for (auto &type : LogicalType::Numeric()) {
		// unary subtract function, negates the input (i.e. multiplies by -1)
		subtract.AddFunction(SubtractFunction::GetFunction(type));
		// binary subtract function "a - b", subtracts b from a
		subtract.AddFunction(SubtractFunction::GetFunction(type, type));
	}
	// we can subtract dates from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::DATE));
	// we can subtract integers from dates
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	// we can subtract timestamps from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::TIMESTAMP));
	// we can subtract intervals from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can subtract intervals from dates/times/timestamps, but not the other way around
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	// we can negate intervals
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL));

	return subtract;
}